

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

int ghc::filesystem::remove(char *__filename)

{
  int iVar1;
  filesystem_error *this;
  error_code ec_00;
  error_code ec;
  uint local_48 [2];
  error_category *local_40;
  string local_38;
  
  local_48[0] = 0;
  local_40 = (error_category *)std::_V2::system_category();
  iVar1 = remove((filesystem *)__filename,(char *)local_48);
  if (local_48[0] == 0) {
    return iVar1;
  }
  this = (filesystem_error *)__cxa_allocate_exception(0x90);
  detail::systemErrorText<int>(&local_38,local_48[0]);
  ec_00._4_4_ = 0;
  ec_00._M_value = local_48[0];
  ec_00._M_cat = local_40;
  filesystem_error::filesystem_error(this,&local_38,(path *)__filename,ec_00);
  __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE bool remove(const path& p)
{
    std::error_code ec;
    auto result = remove(p, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), p, ec);
    }
    return result;
}